

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O0

void __thiscall NPC_Data::NPC_Data(NPC_Data *this,World *world,short id)

{
  short id_local;
  World *world_local;
  NPC_Data *this_local;
  
  this->id = id;
  std::
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ::vector(&this->drops);
  this->drops_chance_total = 0.0;
  std::__cxx11::string::string((string *)&this->shop_name);
  std::__cxx11::string::string((string *)&this->skill_name);
  std::
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ::vector(&this->shop_trade);
  std::
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ::vector(&this->shop_craft);
  std::
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ::vector(&this->skill_learn);
  std::unique_ptr<NPC_Citizenship,std::default_delete<NPC_Citizenship>>::
  unique_ptr<std::default_delete<NPC_Citizenship>,void>
            ((unique_ptr<NPC_Citizenship,std::default_delete<NPC_Citizenship>> *)&this->citizenship)
  ;
  this->world = world;
  LoadShopDrop(this);
  return;
}

Assistant:

NPC_Data::NPC_Data(World* world, short id)
	: id(id)
	, drops_chance_total(0.0)
	, world(world)
{
	this->LoadShopDrop();
}